

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache_service::session::store(session *this)

{
  bool bVar1;
  iterator __first;
  base_cache *pbVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_RDI;
  char *__n;
  string data;
  string key;
  time_t timeout;
  iterator p;
  string ts;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  triggers;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  difference_type in_stack_fffffffffffffea0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *in_stack_fffffffffffffea8;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffef0;
  uint len;
  char *in_stack_fffffffffffffef8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  session *in_stack_ffffffffffffff08;
  string local_c0 [32];
  time_t local_a0;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uint local_3c;
  undefined1 local_38 [56];
  
  len = (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x4860f9);
  if ((*(int *)(in_RDI._M_current + 0x88) + *(int *)(in_RDI._M_current + 0x8c) +
       *(int *)(in_RDI._M_current + 0x90) == *(int *)(in_RDI._M_current + 0x74)) &&
     (*(int *)(in_RDI._M_current + 0x88) != 0)) {
    this_01 = &local_60;
    std::__cxx11::string::string((string *)this_01);
    local_78 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffe98);
    local_70 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_80 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_68 = local_80;
    local_88 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (this_01,in_stack_fffffffffffffee0,in_RDI);
    std::__cxx11::string::c_str();
    bVar1 = load_triggers(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,len);
    if (bVar1) {
      local_a0 = to_time_t(*(int64_t *)(in_RDI._M_current + 0x80));
      std::__cxx11::string::string(local_c0);
      std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffe98);
      std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffe98);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (this_01,in_stack_fffffffffffffee0,in_RDI);
      this_00 = (string *)&stack0xffffffffffffff08;
      std::__cxx11::string::string(this_00);
      __n = in_RDI._M_current + 0x10;
      std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffe98);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
                ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)this_00,
                 (difference_type)__n);
      __first = std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffe98);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
                ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)this_00,
                 (difference_type)__n);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
                ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)this_00,
                 (difference_type)__n);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (this_01,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                         __first._M_current,in_RDI);
      pbVar2 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->
                         ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI._M_current + 200));
      (*pbVar2->_vptr_base_cache[1])(pbVar2,local_c0,&stack0xffffffffffffff08,local_38,local_a0,0);
      in_RDI._M_current[0x48] = '\x06';
      in_RDI._M_current[0x49] = '\0';
      in_RDI._M_current[0x4a] = '\0';
      in_RDI._M_current[0x4b] = '\0';
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      in_RDI._M_current[0x48] = '\x05';
      in_RDI._M_current[0x49] = '\0';
      in_RDI._M_current[0x4a] = '\0';
      in_RDI._M_current[0x4b] = '\0';
    }
    local_3c = (uint)!bVar1;
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    in_RDI._M_current[0x48] = '\x05';
    in_RDI._M_current[0x49] = '\0';
    in_RDI._M_current[0x4a] = '\0';
    in_RDI._M_current[0x4b] = '\0';
    local_3c = 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x486446);
  return;
}

Assistant:

void store()
	{
		std::set<std::string> triggers;
		if(	hin_.operations.store.key_len
			+hin_.operations.store.data_len
			+hin_.operations.store.triggers_len != hin_.size
			|| hin_.operations.store.key_len == 0)
		{
			hout_.opcode=opcodes::error;
			return;
		}
		std::string ts;
		std::vector<char>::iterator p=data_in_.begin()
			+hin_.operations.store.key_len
			+hin_.operations.store.data_len;
		ts.assign(p,p + hin_.operations.store.triggers_len);
		if(!load_triggers(triggers,ts.c_str(),
					hin_.operations.store.triggers_len))
		{
			hout_.opcode=opcodes::error;
			return;
		}
		time_t timeout=to_time_t(hin_.operations.store.timeout);
		std::string key;
		key.assign(data_in_.begin(),data_in_.begin()+hin_.operations.store.key_len);
		std::string data;
		data.assign(data_in_.begin()+hin_.operations.store.key_len,
				data_in_.begin() + hin_.operations.store.key_len + hin_.operations.store.data_len);
		cache_->store(key,data,triggers,timeout);
		hout_.opcode=opcodes::done;
	}